

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseImpl.h
# Opt level: O2

void Eigen::internal::
     compute_inverse<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1>
     ::run(Matrix<double,__1,__1,_0,__1,__1> *matrix,Matrix<double,_3,_3,_0,_3,_3> *result)

{
  PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_a0;
  PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_58;
  
  PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_58,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)matrix);
  PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::inverse
            ((Inverse<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_a0,
             &local_58);
  call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Inverse<Eigen::PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>>>
            (result,(Inverse<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                    &local_a0);
  PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~PartialPivLU(&local_a0);
  PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~PartialPivLU(&local_58);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
  static inline void run(const MatrixType& matrix, ResultType& result)
  {
    result = matrix.partialPivLu().inverse();
  }